

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

BOOL __thiscall Js::FunctionBody::IsInterpreterThunk(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  JavascriptMethod p_Var7;
  FunctionInfo *pFVar8;
  
  pFVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar8 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0075d71a;
    *puVar5 = 0;
    pFVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar8->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_0075d71a;
    *puVar5 = 0;
    pFVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar8);
  pFVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar8 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0075d71a;
    *puVar5 = 0;
    pFVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar8->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_0075d71a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    pFVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  p_Var7 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar8);
  uVar3 = 1;
  if ((p_Var6 != InterpreterStackFrame::DelayDynamicInterpreterThunk) &&
     (p_Var7 != InterpreterStackFrame::StaticInterpreterThunk)) {
    BVar4 = IsDynamicInterpreterThunk(this);
    uVar3 = (uint)(BVar4 != 0);
  }
  return uVar3;
}

Assistant:

BOOL FunctionBody::IsInterpreterThunk() const
    {
        bool isInterpreterThunk = this->GetOriginalEntryPoint_Unchecked() == DefaultEntryThunk;
#if DYNAMIC_INTERPRETER_THUNK
        bool isStaticInterpreterThunk = this->GetOriginalEntryPoint_Unchecked() == InterpreterStackFrame::StaticInterpreterThunk;
        isInterpreterThunk = isInterpreterThunk || isStaticInterpreterThunk || IsDynamicInterpreterThunk();
#endif
        return isInterpreterThunk;
    }